

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::CountDriversFunc::CountDriversFunc(CountDriversFunc *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,CountDrivers,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00b7ee78;
  (this->super_SystemSubroutine).hasOutputArgs = true;
  return;
}

Assistant:

CountDriversFunc() : SystemSubroutine(KnownSystemName::CountDrivers, SubroutineKind::Function) {
        hasOutputArgs = true;
    }